

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O3

Vec_Ptr_t * Nwk_ManRetimeCutBackward(Nwk_Man_t *pMan,int nLatches,int fVerbose)

{
  uint *puVar1;
  void *pvVar2;
  long *plVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  timespec ts;
  timespec local_40;
  
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pMan->nLatches = nLatches;
  pMan->nTruePis = pMan->nObjs[1] - nLatches;
  iVar4 = pMan->nObjs[2] - nLatches;
  pMan->nTruePos = iVar4;
  pVVar8 = pMan->vCis;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      puVar1 = (uint *)((long)pVVar8->pArray[lVar11] + 0x20);
      *puVar1 = *puVar1 | 0x10;
      lVar11 = lVar11 + 1;
      pVVar8 = pMan->vCis;
    } while (lVar11 < pVVar8->nSize);
    iVar4 = pMan->nTruePos;
  }
  if (0 < iVar4) {
    lVar11 = 0;
    do {
      if (pMan->vCos->nSize <= lVar11) goto LAB_0049a364;
      Nwk_ManMarkTfiCone_rec((Nwk_Obj_t *)pMan->vCos->pArray[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 < pMan->nTruePos);
  }
  pVVar8 = pMan->vObjs;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar11];
      if (((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x20) & 7) == 3)) &&
         (*(int *)((long)pvVar2 + 0x3c) == 0)) {
        *(uint *)((long)pvVar2 + 0x20) = *(uint *)((long)pvVar2 + 0x20) | 0x10;
        pVVar8 = pMan->vObjs;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar8->nSize);
  }
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  if (pMan->nLatches < 1) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    iVar14 = 0;
    do {
      uVar5 = pMan->nTruePos + iVar14;
      if (((int)uVar5 < 0) || (pMan->vCos->nSize <= (int)uVar5)) goto LAB_0049a364;
      iVar6 = Nwk_ManPushBackwardFast_rec
                        ((Nwk_Obj_t *)**(undefined8 **)((long)pMan->vCos->pArray[uVar5] + 0x48),
                         (Nwk_Obj_t *)0x0);
      if (iVar6 != 0) {
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        iVar4 = iVar4 + 1;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < pMan->nLatches);
  }
  if (fVerbose != 0) {
    printf("Backward: Max-flow = %4d -> ");
  }
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  if (pMan->nLatches < 1) {
    iVar14 = 0;
  }
  else {
    iVar14 = 0;
    iVar6 = 0;
    do {
      uVar5 = pMan->nTruePos + iVar6;
      if (((int)uVar5 < 0) || (pMan->vCos->nSize <= (int)uVar5)) goto LAB_0049a364;
      iVar7 = Nwk_ManPushBackwardBot_rec
                        ((Nwk_Obj_t *)**(undefined8 **)((long)pMan->vCos->pArray[uVar5] + 0x48),
                         (Nwk_Obj_t *)0x0);
      if (iVar7 != 0) {
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        iVar14 = iVar14 + 1;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < pMan->nLatches);
  }
  if (fVerbose != 0) {
    printf("%4d.  ");
  }
  if (0 < iVar14) {
    Nwk_ManIncrementTravId(pMan);
    Nwk_ManIncrementTravId(pMan);
    Nwk_ManIncrementTravId(pMan);
    if (0 < pMan->nLatches) {
      iVar6 = 0;
      do {
        uVar5 = pMan->nTruePos + iVar6;
        if (((int)uVar5 < 0) || (pMan->vCos->nSize <= (int)uVar5)) goto LAB_0049a364;
        iVar7 = Nwk_ManPushBackwardBot_rec
                          ((Nwk_Obj_t *)**(undefined8 **)((long)pMan->vCos->pArray[uVar5] + 0x48),
                           (Nwk_Obj_t *)0x0);
        if (iVar7 != 0) {
          __assert_fail("!RetValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFlow.c"
                        ,0x23a,"Vec_Ptr_t *Nwk_ManRetimeCutBackward(Nwk_Man_t *, int, int)");
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < pMan->nLatches);
    }
  }
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  uVar16 = 8;
  if (6 < (iVar4 + iVar14) - 1U) {
    uVar16 = (ulong)(uint)(iVar4 + iVar14);
  }
  pVVar8->nSize = 0;
  iVar4 = (int)uVar16;
  pVVar8->nCap = iVar4;
  uVar5 = 0;
  if (iVar4 == 0) {
    ppvVar9 = (void **)0x0;
  }
  else {
    ppvVar9 = (void **)malloc((long)iVar4 << 3);
  }
  pVVar8->pArray = ppvVar9;
  pVVar10 = pMan->vObjs;
  if (0 < pVVar10->nSize) {
    uVar5 = 0;
    lVar11 = 0;
    do {
      plVar3 = (long *)pVVar10->pArray[lVar11];
      if ((plVar3 != (long *)0x0) && (*(int *)(*plVar3 + 0x68) + -2 == (int)plVar3[5])) {
        if ((*(uint *)(plVar3 + 4) & 0x20) == 0) {
          __assert_fail("Nwk_ObjHasFlow(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFlow.c"
                        ,0x243,"Vec_Ptr_t *Nwk_ManRetimeCutBackward(Nwk_Man_t *, int, int)");
        }
        if ((*(uint *)(plVar3 + 4) & 7) == 2) {
          __assert_fail("!Nwk_ObjIsCo(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFlow.c"
                        ,0x244,"Vec_Ptr_t *Nwk_ManRetimeCutBackward(Nwk_Man_t *, int, int)");
        }
        uVar15 = (uint)uVar16;
        if (uVar5 == uVar15) {
          if ((int)uVar15 < 0x10) {
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc(0x80);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
            }
            pVVar8->pArray = ppvVar9;
            pVVar8->nCap = 0x10;
            uVar16 = 0x10;
          }
          else {
            uVar16 = (ulong)(uVar15 * 2);
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc(uVar16 * 8);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar8->pArray,uVar16 * 8);
            }
            pVVar8->pArray = ppvVar9;
            pVVar8->nCap = uVar15 * 2;
          }
        }
        else {
          ppvVar9 = pVVar8->pArray;
        }
        lVar12 = (long)(int)uVar5;
        uVar5 = uVar5 + 1;
        pVVar8->nSize = uVar5;
        ppvVar9[lVar12] = plVar3;
        pVVar10 = pMan->vObjs;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar10->nSize);
  }
  lVar11 = (long)pMan->nLatches;
  if (lVar11 < 1) {
    uVar15 = 0;
  }
  else {
    uVar16 = (ulong)(uint)pMan->nTruePos;
    uVar15 = 0;
    do {
      if ((pMan->nTruePos < 0) || (pMan->vCos->nSize <= (int)uVar16)) {
LAB_0049a364:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar3 = (long *)**(long **)((long)pMan->vCos->pArray[uVar16] + 0x48);
      uVar15 = uVar15 + (*(int *)(*plVar3 + 0x68) + -2 == (int)plVar3[5]);
      uVar16 = uVar16 + 1;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  Nwk_ManCleanMarks(pMan);
  if (fVerbose != 0) {
    iVar4 = 0x8df11e;
    printf("Min-cut = %4d.  Unmoved = %4d. ",(ulong)uVar5,(ulong)uVar15);
    Abc_Print(iVar4,"%s =","Time");
    iVar14 = 3;
    iVar4 = clock_gettime(3,&local_40);
    if (iVar4 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar11 + lVar13) / 1000000.0);
  }
  return pVVar8;
}

Assistant:

Vec_Ptr_t * Nwk_ManRetimeCutBackward( Nwk_Man_t * pMan, int nLatches, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i, RetValue, Counter = 0, Counter2 = 0;
    abctime clk = Abc_Clock();
    // set the sequential parameters
    pMan->nLatches = nLatches;
    pMan->nTruePis = Nwk_ManCiNum(pMan) - nLatches;
    pMan->nTruePos = Nwk_ManCoNum(pMan) - nLatches;
    // mark the CIs, the TFI of POs, and the constant nodes
    Nwk_ManForEachCi( pMan, pObj, i )
        pObj->MarkA = 1;
    Nwk_ManForEachPoSeq( pMan, pObj, i )
        Nwk_ManMarkTfiCone_rec( pObj );
    Nwk_ManForEachNode( pMan, pObj, i )
        if ( Nwk_ObjFaninNum(pObj) == 0 )
            pObj->MarkA = 1;
    // start flow computation from each LI driver
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLiSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushBackwardFast_rec( Nwk_ObjFanin0(pObj), NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter++; 
    }
    if ( fVerbose ) 
    printf( "Backward: Max-flow = %4d -> ", Counter );
    // continue flow computation from each LI driver
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLiSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushBackwardBot_rec( Nwk_ObjFanin0(pObj), NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter2++;
    }
    if ( fVerbose )
    printf( "%4d.  ", Counter+Counter2 );
    // repeat flow computation from each LI driver
    if ( Counter2 > 0 )
    {
        Nwk_ManIncrementTravIdFlow( pMan );
        Nwk_ManForEachLiSeq( pMan, pObj, i )
        {
            RetValue = Nwk_ManPushBackwardBot_rec( Nwk_ObjFanin0(pObj), NULL );
            assert( !RetValue );
        }
    }
    // cut is a set of nodes whose bottom is visited but top is not visited
    vNodes = Vec_PtrAlloc( Counter+Counter2 );
    Nwk_ManForEachObj( pMan, pObj, i )
    {
        if ( Nwk_ObjVisitedBotOnly(pObj) )
        {
            assert( Nwk_ObjHasFlow(pObj) );
            assert( !Nwk_ObjIsCo(pObj) );
            Vec_PtrPush( vNodes, pObj );
        }
    }
    // count CO drivers
    Counter = 0;
    Nwk_ManForEachLiSeq( pMan, pObj, i )
        if ( Nwk_ObjVisitedBotOnly( Nwk_ObjFanin0(pObj) ) )
            Counter++;
    Nwk_ManCleanMarks( pMan );
//    assert( Nwk_ManRetimeVerifyCutBackward(pMan, vNodes) );
    if ( fVerbose )
    {
    printf( "Min-cut = %4d.  Unmoved = %4d. ", Vec_PtrSize(vNodes), Counter );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return vNodes;
}